

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int nonce_function_bip340
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *xonly_pk32,uchar *algo16,void *data)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  uchar masked_key [32];
  secp256k1_sha256 sha;
  uint local_b8 [8];
  secp256k1_sha256 local_98;
  
  if (algo16 == (uchar *)0x0) {
    return 0;
  }
  if (data != (void *)0x0) {
    local_98.s[0] = 0x24dd3219;
    local_98.s[1] = 0x4eba7e70;
    local_98.s[2] = 0xca0fabb9;
    local_98.s[3] = 0xfa3166d;
    local_98.s[4] = 0x3afbe4b1;
    local_98.s[5] = 0x4c44df97;
    local_98.s[6] = 0x4aac2739;
    local_98.s[7] = 0x249e850a;
    local_98.bytes = 0x40;
    secp256k1_sha256_write(&local_98,(uchar *)data,0x20);
    secp256k1_sha256_finalize(&local_98,(uchar *)local_b8);
    lVar4 = 0;
    do {
      puVar1 = (uint *)(key32 + lVar4);
      uVar3 = puVar1[1];
      uVar5 = puVar1[2];
      uVar2 = puVar1[3];
      *(uint *)((long)local_b8 + lVar4) = *puVar1 ^ *(uint *)((long)local_b8 + lVar4);
      *(uint *)((long)local_b8 + lVar4 + 4) = uVar3 ^ *(uint *)((long)local_b8 + lVar4 + 4);
      *(uint *)((long)local_b8 + lVar4 + 8) = uVar5 ^ *(uint *)((long)local_b8 + lVar4 + 8);
      *(uint *)((long)local_b8 + lVar4 + 0xc) = uVar2 ^ *(uint *)((long)local_b8 + lVar4 + 0xc);
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x20);
  }
  lVar4 = 0;
  do {
    if (algo16[lVar4] != "BIP0340/nonce"[lVar4]) {
      uVar3 = 0x11;
      goto LAB_001200b2;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  local_98.s[0] = 0x46615b35;
  local_98.s[1] = 0xf4bfbff7;
  local_98.s[2] = 0x9f8dc671;
  local_98.s[3] = 0x83627ab3;
  local_98.s[4] = 0x60217180;
  local_98.s[5] = 0x57358661;
  local_98.s[6] = 0x21a29e54;
  local_98.s[7] = 0x68b07b4c;
  local_98.bytes = 0x40;
  goto LAB_001200d5;
  while (uVar3 = uVar3 - 1, 1 < uVar3) {
LAB_001200b2:
    uVar5 = uVar3 - 1;
    if (algo16[(ulong)uVar5 - 1] != '\0') goto LAB_001200c5;
  }
  uVar5 = 0;
LAB_001200c5:
  secp256k1_sha256_initialize_tagged(&local_98,algo16,(long)(int)uVar5);
LAB_001200d5:
  if (data != (void *)0x0) {
    key32 = (uchar *)local_b8;
  }
  secp256k1_sha256_write(&local_98,key32,0x20);
  secp256k1_sha256_write(&local_98,xonly_pk32,0x20);
  secp256k1_sha256_write(&local_98,msg32,0x20);
  secp256k1_sha256_finalize(&local_98,nonce32);
  return 1;
}

Assistant:

static int nonce_function_bip340(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *xonly_pk32, const unsigned char *algo16, void *data) {
    secp256k1_sha256 sha;
    unsigned char masked_key[32];
    int i;

    if (algo16 == NULL) {
        return 0;
    }

    if (data != NULL) {
        secp256k1_nonce_function_bip340_sha256_tagged_aux(&sha);
        secp256k1_sha256_write(&sha, data, 32);
        secp256k1_sha256_finalize(&sha, masked_key);
        for (i = 0; i < 32; i++) {
            masked_key[i] ^= key32[i];
        }
    }

    /* Tag the hash with algo16 which is important to avoid nonce reuse across
     * algorithms. If this nonce function is used in BIP-340 signing as defined
     * in the spec, an optimized tagging implementation is used. */
    if (secp256k1_memcmp_var(algo16, bip340_algo16, 16) == 0) {
        secp256k1_nonce_function_bip340_sha256_tagged(&sha);
    } else {
        int algo16_len = 16;
        /* Remove terminating null bytes */
        while (algo16_len > 0 && !algo16[algo16_len - 1]) {
            algo16_len--;
        }
        secp256k1_sha256_initialize_tagged(&sha, algo16, algo16_len);
    }

    /* Hash (masked-)key||pk||msg using the tagged hash as per the spec */
    if (data != NULL) {
        secp256k1_sha256_write(&sha, masked_key, 32);
    } else {
        secp256k1_sha256_write(&sha, key32, 32);
    }
    secp256k1_sha256_write(&sha, xonly_pk32, 32);
    secp256k1_sha256_write(&sha, msg32, 32);
    secp256k1_sha256_finalize(&sha, nonce32);
    return 1;
}